

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

void __thiscall And::And(And *this,shared_ptr<Token> *t,shared_ptr<Expr> *x1,shared_ptr<Expr> *x2)

{
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&t->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&x1->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
  Logical::Logical(&this->super_Logical,(shared_ptr<Token> *)&local_40,(shared_ptr<Expr> *)&local_50
                   ,(shared_ptr<Expr> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_Logical).super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR_toJson_abi_cxx11__0012b5c8;
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             &(((x1->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type).
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,
             &(((x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type).
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_Logical).super_Expr.super_Node._vptr_Node[7])(&local_70,this,&local_80,&local_90);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_Logical).super_Expr.type.
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>,&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  return;
}

Assistant:

And(std::shared_ptr<Token> t, std::shared_ptr<Expr> x1, std::shared_ptr<Expr> x2) : Logical(t, x1, x2) {
		type = check(x1->type, x2->type);
	}